

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmTargetSelectLinker::Choose_abi_cxx11_(string *__return_storage_ptr__,cmTargetSelectLinker *this)

{
  size_t sVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  cmake *this_00;
  string local_218;
  cmListFileBacktrace local_1f8;
  stringstream e;
  ostream local_1a8;
  
  sVar1 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 1) {
    if (sVar1 == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&e);
      return __return_storage_ptr__;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&e);
    poVar2 = std::operator<<(&local_1a8,"Target ");
    poVar2 = std::operator<<(poVar2,(string *)&this->Target->Target->Name);
    poVar2 = std::operator<<(poVar2,
                             " contains multiple languages with the highest linker preference");
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Preference);
    std::operator<<(poVar2,"):\n");
    for (p_Var3 = (this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Preferred)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      poVar2 = std::operator<<(&local_1a8,"  ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
      std::operator<<(poVar2,"\n");
    }
    std::operator<<(&local_1a8,"Set the LINKER_LANGUAGE property for this target.");
    this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_1f8,this->Target);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_218,&local_1f8,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::stringstream::~stringstream((stringstream *)&e);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)((this->Preferred)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1))
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string Choose()
    {
    if(this->Preferred.empty())
      {
      return "";
      }
    else if(this->Preferred.size() > 1)
      {
      std::stringstream e;
      e << "Target " << this->Target->GetName()
        << " contains multiple languages with the highest linker preference"
        << " (" << this->Preference << "):\n";
      for(std::set<std::string>::const_iterator
            li = this->Preferred.begin(); li != this->Preferred.end(); ++li)
        {
        e << "  " << *li << "\n";
        }
      e << "Set the LINKER_LANGUAGE property for this target.";
      cmake* cm = this->Target->GetLocalGenerator()->GetCMakeInstance();
      cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                       this->Target->GetBacktrace());
      }
    return *this->Preferred.begin();
    }